

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallDirectoryGenerator.cxx
# Opt level: O3

void __thiscall
cmInstallDirectoryGenerator::GenerateScriptForConfig
          (cmInstallDirectoryGenerator *this,ostream *os,string *config,Indent *indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Snapshot snapshot;
  char *pcVar2;
  pointer pbVar3;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  cmGeneratorExpression ge;
  allocator local_129;
  auto_ptr<cmCompiledGeneratorExpression> local_128;
  cmCommandContext local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  ostream *local_d8;
  Indent *local_d0;
  undefined1 local_c8 [64];
  Snapshot local_88;
  cmGeneratorExpression local_70;
  
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8 = os;
  local_d0 = indent;
  cmState::Snapshot::Snapshot(&local_88,(cmState *)0x0);
  paVar1 = &local_120.Name.field_2;
  local_120.Name._M_string_length = 0;
  local_120.Name.field_2._M_local_buf[0] = '\0';
  local_120.Line = 0;
  snapshot.Position.Tree = local_88.Position.Tree;
  snapshot.State = local_88.State;
  snapshot.Position.Position = local_88.Position.Position;
  local_120.Name._M_dataplus._M_p = (pointer)paVar1;
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_c8,snapshot,&local_120);
  cmGeneratorExpression::cmGeneratorExpression(&local_70,(cmListFileBacktrace *)local_c8);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.Name._M_dataplus._M_p != paVar1) {
    operator_delete(local_120.Name._M_dataplus._M_p,
                    CONCAT71(local_120.Name.field_2._M_allocated_capacity._1_7_,
                             local_120.Name.field_2._M_local_buf[0]) + 1);
  }
  pbVar3 = (this->Directories).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar3 != (this->Directories).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      cmGeneratorExpression::Parse((cmGeneratorExpression *)local_c8,(string *)&local_70);
      local_128.x_ = (cmCompiledGeneratorExpression *)local_c8._0_8_;
      local_c8._0_8_ = (cmCompiledGeneratorExpression *)0x0;
      cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                ((auto_ptr<cmCompiledGeneratorExpression> *)local_c8);
      local_120.Name._M_string_length = 0;
      local_120.Name.field_2._M_local_buf[0] = '\0';
      local_120.Name._M_dataplus._M_p = (pointer)paVar1;
      pcVar2 = cmCompiledGeneratorExpression::Evaluate
                         (local_128.x_,this->LocalGenerator,config,false,(cmGeneratorTarget *)0x0,
                          (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                          &local_120.Name);
      std::__cxx11::string::string((string *)local_c8,pcVar2,&local_129);
      cmSystemTools::ExpandListArgument((string *)local_c8,&local_f8,false);
      if ((cmCompiledGeneratorExpression *)local_c8._0_8_ !=
          (cmCompiledGeneratorExpression *)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120.Name._M_dataplus._M_p != paVar1) {
        operator_delete(local_120.Name._M_dataplus._M_p,
                        CONCAT71(local_120.Name.field_2._M_allocated_capacity._1_7_,
                                 local_120.Name.field_2._M_local_buf[0]) + 1);
      }
      cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_128);
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != (this->Directories).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  AddDirectoryInstallRule(this,local_d8,config,local_d0,&local_f8);
  cmGeneratorExpression::~cmGeneratorExpression(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  return;
}

Assistant:

void cmInstallDirectoryGenerator::GenerateScriptForConfig(
  std::ostream& os,
  const std::string& config,
  Indent const& indent)
{
  std::vector<std::string> dirs;
  cmGeneratorExpression ge;
  for(std::vector<std::string>::const_iterator i = this->Directories.begin();
      i != this->Directories.end(); ++i)
    {
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(*i);
    cmSystemTools::ExpandListArgument(cge->Evaluate(
        this->LocalGenerator, config), dirs);
    }
  this->AddDirectoryInstallRule(os, config, indent, dirs);
}